

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O1

vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> * __thiscall
banksia::TourMng::collectStats
          (vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *__return_storage_ptr__
          ,TourMng *this)

{
  int iVar1;
  ResultType RVar2;
  ReasonType RVar3;
  pointer pcVar4;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *this_00;
  int iVar5;
  pointer pMVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  size_type *psVar10;
  long lVar11;
  string name;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *resultList;
  TourPlayer r;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  resultMap;
  size_type *local_e8;
  key_type local_e0;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *local_c0;
  pointer local_b8;
  undefined **local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  _Base_ptr local_78;
  undefined8 uStack_70;
  int local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar6 = (this->matchRecordList).
           super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8 = (this->matchRecordList).
             super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_c0 = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pMVar6 != local_b8) {
    local_e8 = &pMVar6->playernames[0]._M_string_length;
    do {
      if ((pMVar6->result).result != noresult) {
        lVar11 = 0x20;
        psVar10 = local_e8;
        do {
          pcVar4 = (((string *)(psVar10 + -1))->_M_dataplus)._M_p;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pcVar4,pcVar4 + *psVar10);
          if (local_e0._M_string_length != 0) {
            local_b0 = &PTR__TourPlayer_001c21e8;
            local_a0 = 0;
            local_98[0] = 0;
            local_78 = (_Base_ptr)0x0;
            uStack_70 = 0;
            local_88 = (_Base_ptr)0x0;
            uStack_80 = (_Base_ptr)0x0;
            local_68 = 0;
            local_a8 = local_98;
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                    ::find(&local_60,&local_e0);
            if ((_Rb_tree_header *)iVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::_M_assign((string *)&local_a8);
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_a8);
              local_68 = *(int *)&iVar7._M_node[4]._M_parent;
              local_88 = iVar7._M_node[3]._M_parent;
              uStack_80 = iVar7._M_node[3]._M_left;
              local_78 = iVar7._M_node[3]._M_right;
              uStack_70 = *(undefined8 *)(iVar7._M_node + 4);
            }
            if (*(long *)((long)&pMVar6->playernames[0]._M_string_length + lVar11) == 0) {
              uStack_70 = CONCAT44(uStack_70._4_4_ + 1,(undefined4)uStack_70);
            }
            iVar5 = uStack_80._4_4_;
            iVar1 = (int)local_88 + 1;
            local_88 = (_Base_ptr)CONCAT44(local_88._4_4_,iVar1);
            RVar2 = (pMVar6->result).result;
            if (RVar2 == loss) {
              if (lVar11 == 0x20) {
LAB_00160dec:
                local_88 = (_Base_ptr)CONCAT44(local_88._4_4_ + 1,iVar1);
              }
              else {
LAB_00160dd7:
                uStack_80 = (_Base_ptr)CONCAT44(uStack_80._4_4_ + 1,(int)uStack_80);
              }
            }
            else if (RVar2 == draw) {
              uStack_80 = (_Base_ptr)CONCAT44(uStack_80._4_4_,(int)uStack_80 + 1);
            }
            else if (RVar2 == win) {
              if (lVar11 == 0) goto LAB_00160dec;
              goto LAB_00160dd7;
            }
            if (((iVar5 < uStack_80._4_4_) &&
                (RVar3 = (pMVar6->result).reason, RVar3 < (crash|mate))) &&
               ((0x580U >> (RVar3 & 0x1f) & 1) != 0)) {
              local_78 = (_Base_ptr)CONCAT44(local_78._4_4_,(int)local_78 + 1);
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                                   *)&local_60,&local_e0);
            std::__cxx11::string::_M_assign((string *)&pmVar8->name);
            pmVar8->whiteCnt = local_68;
            *(_Base_ptr *)&pmVar8->abnormalCnt = local_78;
            pmVar8->flag = (undefined4)uStack_70;
            pmVar8->byeCnt = uStack_70._4_4_;
            pmVar8->gameCnt = (int)local_88;
            pmVar8->winCnt = local_88._4_4_;
            pmVar8->drawCnt = (int)uStack_80;
            pmVar8->lossCnt = uStack_80._4_4_;
            local_b0 = &PTR__TourPlayer_001c21e8;
            if (local_a8 != local_98) {
              operator_delete(local_a8);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          psVar10 = psVar10 + 4;
          lVar11 = lVar11 + -0x20;
        } while (lVar11 == 0);
      }
      pMVar6 = pMVar6 + 1;
      local_e8 = local_e8 + 0x18;
    } while (pMVar6 != local_b8);
  }
  this_00 = local_c0;
  (local_c0->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_c0->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_c0->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::push_back
              (this_00,(value_type *)(p_Var9 + 2));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  ::~_Rb_tree(&local_60);
  return this_00;
}

Assistant:

std::vector<TourPlayer> TourMng::collectStats() const
{
    std::map<std::string, TourPlayer> resultMap;
    
    for(auto && m : matchRecordList) {
        if (m.result.result == ResultType::noresult) { // hm ?
            continue;
        }
        
        for(int sd = 0; sd < 2; sd++) {
            auto name = m.playernames[sd];
            if (name.empty()) { // bye players (in knockout) won without opponents
                continue;
            }
            
            TourPlayer r;
            auto it = resultMap.find(name);
            if (it == resultMap.end()) {
                r.name = name;
            } else {
                r = it->second; assert(r.name == name);
            }
            
            if (m.playernames[1 - sd].empty()) { // bye player
                r.byeCnt++;
            }
            
            auto lossCnt = r.lossCnt;
            r.gameCnt++;
            switch (m.result.result) {
                case ResultType::win:
                    if (sd == W) r.winCnt++; else r.lossCnt++;
                    break;
                case ResultType::draw:
                    r.drawCnt++;
                    break;
                case ResultType::loss:
                    if (sd == B) r.winCnt++; else r.lossCnt++;
                    break;
                default:
                    assert(false);
                    break;
            }
            
            if (lossCnt < r.lossCnt) {
                if (m.result.reason == ReasonType::illegalmove || m.result.reason == ReasonType::crash || m.result.reason == ReasonType::timeout) {
                    r.abnormalCnt++;
                }
            }
            resultMap[name] = r;
        }
    }
    
    std::vector<TourPlayer> resultList;
    for (auto && s : resultMap) {
        resultList.push_back(s.second);
    }
    return resultList;
}